

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

string * spdlog::details::os::dir_name(filename_t *path)

{
  long lVar1;
  char *in_RSI;
  string *in_RDI;
  size_type pos;
  
  lVar1 = std::__cxx11::string::find_last_of(in_RSI,0x2c305c);
  if (lVar1 == -1) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t dir_name(const filename_t &path) {
    auto pos = path.find_last_of(folder_seps_filename);
    return pos != filename_t::npos ? path.substr(0, pos) : filename_t{};
}